

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O2

int mbedtls_ssl_tls12_write_client_hello_exts
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,int uses_ec,size_t *out_len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int iVar2;
  uchar *puVar3;
  int line;
  char *text;
  ulong __n;
  long lVar4;
  uchar *puVar5;
  size_t local_50;
  ushort *local_48;
  uchar *local_40;
  size_t *local_38;
  
  *out_len = 0;
  puVar5 = buf;
  if (uses_ec == 0) {
LAB_0018dedf:
    local_50 = 0;
    iVar2 = mbedtls_ecjpake_check(&ssl->handshake->ecjpake_ctx);
    local_40 = end;
    if (iVar2 == 0) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x97,"client hello, adding ecjpake_kkpp extension");
      iVar2 = -0x6a00;
      if (3 < (ulong)((long)end - (long)puVar5) && puVar5 <= end) {
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        local_48 = (ushort *)(puVar5 + 2);
        if ((ssl->handshake->ecjpake_cache == (uchar *)0x0) ||
           (ssl->handshake->ecjpake_cache_len == 0)) {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xa5,"generating new ecjpake parameters");
          iVar2 = mbedtls_ecjpake_write_round_one
                            (&ssl->handshake->ecjpake_ctx,puVar5 + 4,
                             (size_t)(local_40 + (-2 - (long)local_48)),&local_50,
                             (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,
                             ssl->conf->p_rng);
          __n = local_50;
          if (iVar2 == 0) {
            local_38 = out_len;
            puVar3 = (uchar *)calloc(1,local_50);
            pmVar1 = ssl->handshake;
            pmVar1->ecjpake_cache = puVar3;
            if (puVar3 != (uchar *)0x0) {
              memcpy(puVar3,puVar5 + 4,__n);
              pmVar1->ecjpake_cache_len = __n;
              goto LAB_0018e17d;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0xbe,"allocation failed");
            iVar2 = -0x7f00;
          }
          else {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                       ,0xb7,"mbedtls_ecjpake_write_round_one",iVar2);
          }
        }
        else {
          local_38 = out_len;
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xc5,"re-using cached ecjpake parameters");
          __n = ssl->handshake->ecjpake_cache_len;
          puVar3 = puVar5 + 4;
          if (__n <= (ulong)((long)local_40 - (long)puVar3) && puVar3 <= local_40) {
            memcpy(puVar3,ssl->handshake->ecjpake_cache,__n);
LAB_0018e17d:
            *local_48 = (ushort)__n << 8 | (ushort)__n >> 8;
            lVar4 = __n + 4;
            goto LAB_0018df05;
          }
        }
      }
      text = "ssl_write_ecjpake_kkpp_ext";
      line = 0x22b;
      goto LAB_0018e12d;
    }
    lVar4 = 0;
    local_38 = out_len;
LAB_0018df05:
    puVar5 = puVar5 + lVar4;
    if (ssl->conf->mfl_code == '\0') {
      lVar4 = 0;
LAB_0018e060:
      *local_38 = (size_t)(puVar5 + (lVar4 - (long)buf));
      return 0;
    }
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x111,"client hello, adding max_fragment_length extension");
    if (4 < (ulong)((long)local_40 - (long)puVar5) && puVar5 <= local_40) {
      puVar5[0] = '\0';
      puVar5[1] = '\x01';
      puVar5[2] = '\0';
      puVar5[3] = '\x01';
      puVar5[4] = ssl->conf->mfl_code;
      lVar4 = 5;
      goto LAB_0018e060;
    }
    text = "ssl_write_max_fragment_length_ext";
    line = 0x23c;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x6a,"client hello, adding supported_point_formats extension");
    if (buf <= end && 5 < (ulong)((long)end - (long)buf)) {
      buf[0] = '\0';
      buf[1] = '\v';
      buf[2] = '\0';
      buf[3] = '\x02';
      buf[4] = '\x01';
      buf[5] = '\0';
      puVar5 = buf + 6;
      goto LAB_0018dedf;
    }
    text = "ssl_write_supported_point_formats_ext";
    line = 0x222;
  }
  iVar2 = -0x6a00;
LAB_0018e12d:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
             ,line,text,iVar2);
  return iVar2;
}

Assistant:

int mbedtls_ssl_tls12_write_client_hello_exts(mbedtls_ssl_context *ssl,
                                              unsigned char *buf,
                                              const unsigned char *end,
                                              int uses_ec,
                                              size_t *out_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = buf;
    size_t ext_len = 0;

    (void) ssl;
    (void) end;
    (void) uses_ec;
    (void) ret;
    (void) ext_len;

    *out_len = 0;

    /* Note that TLS_EMPTY_RENEGOTIATION_INFO_SCSV is always added
     * even if MBEDTLS_SSL_RENEGOTIATION is not defined. */
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if ((ret = ssl_write_renegotiation_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_renegotiation_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_SOME_ECDH_OR_ECDHE_1_2_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ALLOWED_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if (uses_ec) {
        if ((ret = ssl_write_supported_point_formats_ext(ssl, p, end,
                                                         &ext_len)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_supported_point_formats_ext", ret);
            return ret;
        }
        p += ext_len;
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if ((ret = ssl_write_ecjpake_kkpp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_ecjpake_kkpp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
    if ((ret = ssl_write_cid_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_cid_ext", ret);
        return ret;
    }
    p += ext_len;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    if ((ret = ssl_write_max_fragment_length_ext(ssl, p, end,
                                                 &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_max_fragment_length_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    if ((ret = ssl_write_encrypt_then_mac_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_encrypt_then_mac_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    if ((ret = ssl_write_extended_ms_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_extended_ms_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_SRTP)
    if ((ret = ssl_write_use_srtp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_use_srtp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if ((ret = ssl_write_session_ticket_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_session_ticket_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

    *out_len = p - buf;

    return 0;
}